

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestStringToDoubleSeparator(void)

{
  bool *processed_all;
  char *pcVar1;
  undefined8 uVar2;
  char char_separator;
  char *pcVar3;
  uc16 in_R9W;
  double dVar4;
  undefined8 uVar5;
  bool all_used;
  int processed;
  bool local_5;
  int local_4;
  
  dVar4 = StrToD("000\'001.0\'0",0,0.0,&local_4,&local_5,0x27);
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    pcVar1 = "1.0";
    pcVar3 = "StrToD(\"000\'001.0\'0\", flags, 0.0, &processed, &all_used, separator)";
    uVar5 = 0x3ff0000000000000;
    uVar2 = 0xd59;
  }
  else {
    if (local_5 == false) {
      uVar2 = 0xd5a;
LAB_0084de3c:
      printf("%s:%d:\n CHECK(%s) failed\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
             ,uVar2,"all_used");
      abort();
    }
    dVar4 = StrToD("0\'0\'0\'0\'0\'1.0\'0",0,0.0,&local_4,&local_5,0x27);
    if ((dVar4 != 1.0) || (NAN(dVar4))) {
      pcVar1 = "1.0";
      pcVar3 = "StrToD(\"0\'0\'0\'0\'0\'1.0\'0\", flags, 0.0, &processed, &all_used, separator)";
      uVar5 = 0x3ff0000000000000;
      uVar2 = 0xd5d;
    }
    else {
      if (local_5 == false) {
        uVar2 = 0xd5e;
        goto LAB_0084de3c;
      }
      dVar4 = StrToD("\'1.0",0,0.0,&local_4,&local_5,0x27);
      if (NAN(dVar4)) {
        if (local_4 != 0) {
          uVar2 = 0xd62;
LAB_0084dcf1:
          printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
                 ,uVar2,"0","processed",0,local_4);
          abort();
        }
        dVar4 = StrToD("1\'.0",0,0.0,&local_4,&local_5,0x27);
        if (NAN(dVar4)) {
          if (local_4 != 0) {
            uVar2 = 0xd66;
            goto LAB_0084dcf1;
          }
          dVar4 = StrToD("1.\'0",0,0.0,&local_4,&local_5,0x27);
          if (NAN(dVar4)) {
            if (local_4 != 0) {
              uVar2 = 0xd6a;
              goto LAB_0084dcf1;
            }
            dVar4 = StrToD("0\'\'1.0",0,0.0,&local_4,&local_5,0x27);
            if (NAN(dVar4)) {
              if (local_4 != 0) {
                uVar2 = 0xd6e;
                goto LAB_0084dcf1;
              }
              dVar4 = StrToD("1.0e1\'0",0,0.0,&local_4,&local_5,0x27);
              if (NAN(dVar4)) {
                if (local_4 != 0) {
                  uVar2 = 0xd72;
                  goto LAB_0084dcf1;
                }
                dVar4 = StrToD("1.0e1\'",0,0.0,&local_4,&local_5,0x27);
                if (NAN(dVar4)) {
                  if (local_4 != 0) {
                    uVar2 = 0xd76;
                    goto LAB_0084dcf1;
                  }
                  dVar4 = StrToD("1.0e\'1",0,0.0,&local_4,&local_5,0x27);
                  if (NAN(dVar4)) {
                    if (local_4 != 0) {
                      uVar2 = 0xd7a;
                      goto LAB_0084dcf1;
                    }
                    dVar4 = StrToD("1.0\'e1",0,0.0,&local_4,&local_5,0x27);
                    if (NAN(dVar4)) {
                      if (local_4 != 0) {
                        uVar2 = 0xd7e;
                        goto LAB_0084dcf1;
                      }
                      dVar4 = StrToD("+\'1.0e1",0,0.0,&local_4,&local_5,0x27);
                      if (NAN(dVar4)) {
                        if (local_4 != 0) {
                          uVar2 = 0xd82;
                          goto LAB_0084dcf1;
                        }
                        dVar4 = StrToD("-\'1.0e1",0,0.0,&local_4,&local_5,0x27);
                        if (NAN(dVar4)) {
                          if (local_4 != 0) {
                            uVar2 = 0xd86;
                            goto LAB_0084dcf1;
                          }
                          dVar4 = StrToD("1.0e+\'1",0,0.0,&local_4,&local_5,0x27);
                          if (NAN(dVar4)) {
                            if (local_4 != 0) {
                              uVar2 = 0xd8a;
                              goto LAB_0084dcf1;
                            }
                            dVar4 = StrToD("1.0e-\'1",0,0.0,&local_4,&local_5,0x27);
                            if (NAN(dVar4)) {
                              if (local_4 != 0) {
                                uVar2 = 0xd8e;
                                goto LAB_0084dcf1;
                              }
                              dVar4 = StrToD("1.0e\'+1",0,0.0,&local_4,&local_5,0x27);
                              if (NAN(dVar4)) {
                                if (local_4 != 0) {
                                  uVar2 = 0xd92;
                                  goto LAB_0084dcf1;
                                }
                                dVar4 = StrToD("1.0e\'-1",0,0.0,&local_4,&local_5,0x27);
                                if (NAN(dVar4)) {
                                  if (local_4 != 0) {
                                    uVar2 = 0xd96;
                                    goto LAB_0084dcf1;
                                  }
                                  dVar4 = StrToD("000 001.0 0",0,0.0,&local_4,&local_5,0x20);
                                  if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                    pcVar1 = "1.0";
                                    pcVar3 = 
                                    "StrToD(\"000 001.0 0\", flags, 0.0, &processed, &all_used, separator)"
                                    ;
                                    uVar5 = 0x3ff0000000000000;
                                    uVar2 = 0xd9c;
                                  }
                                  else {
                                    if (local_5 == false) {
                                      uVar2 = 0xd9d;
                                      goto LAB_0084de3c;
                                    }
                                    dVar4 = StrToD("0 0 0 0 0 1.0 0",0,0.0,&local_4,&local_5,0x20);
                                    if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                      pcVar1 = "1.0";
                                      pcVar3 = 
                                      "StrToD(\"0 0 0 0 0 1.0 0\", flags, 0.0, &processed, &all_used, separator)"
                                      ;
                                      uVar5 = 0x3ff0000000000000;
                                      uVar2 = 0xda0;
                                    }
                                    else {
                                      if (local_5 == false) {
                                        uVar2 = 0xda1;
                                        goto LAB_0084de3c;
                                      }
                                      dVar4 = StrToD(" 1.0",0,0.0,&local_4,&local_5,0x20);
                                      if (NAN(dVar4)) {
                                        if (local_4 != 0) {
                                          uVar2 = 0xda5;
                                          goto LAB_0084dcf1;
                                        }
                                        dVar4 = StrToD("1 .0",0,0.0,&local_4,&local_5,0x20);
                                        if (NAN(dVar4)) {
                                          if (local_4 != 0) {
                                            uVar2 = 0xda9;
                                            goto LAB_0084dcf1;
                                          }
                                          dVar4 = StrToD("1. 0",0,0.0,&local_4,&local_5,0x20);
                                          if (NAN(dVar4)) {
                                            if (local_4 != 0) {
                                              uVar2 = 0xdad;
                                              goto LAB_0084dcf1;
                                            }
                                            dVar4 = StrToD("0  1.0",0,0.0,&local_4,&local_5,0x20);
                                            if (NAN(dVar4)) {
                                              if (local_4 != 0) {
                                                uVar2 = 0xdb1;
                                                goto LAB_0084dcf1;
                                              }
                                              dVar4 = StrToD("1.0e1 0",0,0.0,&local_4,&local_5,0x20)
                                              ;
                                              if (NAN(dVar4)) {
                                                if (local_4 != 0) {
                                                  uVar2 = 0xdb5;
                                                  goto LAB_0084dcf1;
                                                }
                                                dVar4 = StrToD("1.0e1 ",0,0.0,&local_4,&local_5,0x20
                                                              );
                                                if (NAN(dVar4)) {
                                                  if (local_4 != 0) {
                                                    uVar2 = 0xdb9;
                                                    goto LAB_0084dcf1;
                                                  }
                                                  dVar4 = StrToD("1.0e 1",0,0.0,&local_4,&local_5,
                                                                 0x20);
                                                  if (NAN(dVar4)) {
                                                    if (local_4 != 0) {
                                                      uVar2 = 0xdbd;
                                                      goto LAB_0084dcf1;
                                                    }
                                                    dVar4 = StrToD("1.0 e1",0,0.0,&local_4,&local_5,
                                                                   0x20);
                                                    if (NAN(dVar4)) {
                                                      if (local_4 != 0) {
                                                        uVar2 = 0xdc1;
                                                        goto LAB_0084dcf1;
                                                      }
                                                      dVar4 = StrToD("+ 1.0e1",0,0.0,&local_4,
                                                                     &local_5,0x20);
                                                      if (NAN(dVar4)) {
                                                        if (local_4 != 0) {
                                                          uVar2 = 0xdc5;
                                                          goto LAB_0084dcf1;
                                                        }
                                                        dVar4 = StrToD("- 1.0e1",0,0.0,&local_4,
                                                                       &local_5,0x20);
                                                        if (NAN(dVar4)) {
                                                          if (local_4 != 0) {
                                                            uVar2 = 0xdc9;
                                                            goto LAB_0084dcf1;
                                                          }
                                                          dVar4 = StrToD("1.0e+ 1",0,0.0,&local_4,
                                                                         &local_5,0x20);
                                                          if (NAN(dVar4)) {
                                                            if (local_4 != 0) {
                                                              uVar2 = 0xdcd;
                                                              goto LAB_0084dcf1;
                                                            }
                                                            dVar4 = StrToD("1.0e- 1",0,0.0,&local_4,
                                                                           &local_5,0x20);
                                                            if (NAN(dVar4)) {
                                                              if (local_4 != 0) {
                                                                uVar2 = 0xdd1;
                                                                goto LAB_0084dcf1;
                                                              }
                                                              dVar4 = StrToD("1.0e +1",0,0.0,
                                                                             &local_4,&local_5,0x20)
                                                              ;
                                                              if (NAN(dVar4)) {
                                                                if (local_4 != 0) {
                                                                  uVar2 = 0xdd5;
                                                                  goto LAB_0084dcf1;
                                                                }
                                                                dVar4 = StrToD("1.0e -1",0,0.0,
                                                                               &local_4,&local_5,
                                                                               0x20);
                                                                if (NAN(dVar4)) {
                                                                  if (local_4 != 0) {
                                                                    uVar2 = 0xdd9;
                                                                    goto LAB_0084dcf1;
                                                                  }
                                                                  dVar4 = StrToD("000 001.0 0",0x18,
                                                                                 0.0,&local_4,
                                                                                 &local_5,0x20);
                                                                  if ((dVar4 != 1.0) || (NAN(dVar4))
                                                                     ) {
                                                                    pcVar1 = "1.0";
                                                                    pcVar3 = 
                                                  "StrToD(\"000 001.0 0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0xde0;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xde1;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0 0 0 0 0 1.0 0",0x18,0.0,
                                                                   &local_4,&local_5,0x20);
                                                    if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                      pcVar1 = "1.0";
                                                      pcVar3 = 
                                                  "StrToD(\"0 0 0 0 0 1.0 0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0xde4;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xde5;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("  000 001.0 0   ",0x18,0.0,
                                                                   &local_4,&local_5,0x20);
                                                    if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                      pcVar1 = "1.0";
                                                      pcVar3 = 
                                                  "StrToD(\"  000 001.0 0   \", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0xde8;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xde9;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("   0 0 0 0 0 1.0 0   ",0x18,0.0,
                                                                   &local_4,&local_5,0x20);
                                                    if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                      pcVar1 = "1.0";
                                                      pcVar3 = 
                                                  "StrToD(\"   0 0 0 0 0 1.0 0   \", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0xdec;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xded;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD(" 1.0",0x18,0.0,&local_4,&local_5
                                                                   ,0x20);
                                                    if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                      pcVar1 = "1.0";
                                                      pcVar3 = 
                                                  "StrToD(\" 1.0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0xdf0;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xdf1;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("1 .0",0x18,0.0,&local_4,&local_5
                                                                   ,0x20);
                                                    if (NAN(dVar4)) {
                                                      if (local_4 != 0) {
                                                        uVar2 = 0xdf5;
                                                        goto LAB_0084dcf1;
                                                      }
                                                      dVar4 = StrToD("1. 0",0x18,0.0,&local_4,
                                                                     &local_5,0x20);
                                                      if (NAN(dVar4)) {
                                                        if (local_4 != 0) {
                                                          uVar2 = 0xdf9;
                                                          goto LAB_0084dcf1;
                                                        }
                                                        dVar4 = StrToD("0  1.0",0x18,0.0,&local_4,
                                                                       &local_5,0x20);
                                                        if (NAN(dVar4)) {
                                                          if (local_4 != 0) {
                                                            uVar2 = 0xdfd;
                                                            goto LAB_0084dcf1;
                                                          }
                                                          dVar4 = StrToD("1.0e1 0",0x18,0.0,&local_4
                                                                         ,&local_5,0x20);
                                                          if (NAN(dVar4)) {
                                                            if (local_4 != 0) {
                                                              uVar2 = 0xe01;
                                                              goto LAB_0084dcf1;
                                                            }
                                                            dVar4 = StrToD("1.0e1 ",0x18,0.0,
                                                                           &local_4,&local_5,0x20);
                                                            if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                              pcVar1 = "10.0";
                                                              pcVar3 = 
                                                  "StrToD(\"1.0e1 \", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xe04;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe05;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("1.0e 1",0x18,0.0,&local_4,
                                                                   &local_5,0x20);
                                                    if (NAN(dVar4)) {
                                                      if (local_4 != 0) {
                                                        uVar2 = 0xe09;
                                                        goto LAB_0084dcf1;
                                                      }
                                                      dVar4 = StrToD("1.0 e1",0x18,0.0,&local_4,
                                                                     &local_5,0x20);
                                                      if (NAN(dVar4)) {
                                                        if (local_4 != 0) {
                                                          uVar2 = 0xe0d;
                                                          goto LAB_0084dcf1;
                                                        }
                                                        dVar4 = StrToD("+ 1.0e1",0x18,0.0,&local_4,
                                                                       &local_5,0x20);
                                                        if (NAN(dVar4)) {
                                                          if (local_4 != 0) {
                                                            uVar2 = 0xe11;
                                                            goto LAB_0084dcf1;
                                                          }
                                                          dVar4 = StrToD("- 1.0e1",0x18,0.0,&local_4
                                                                         ,&local_5,0x20);
                                                          if (NAN(dVar4)) {
                                                            if (local_4 != 0) {
                                                              uVar2 = 0xe15;
                                                              goto LAB_0084dcf1;
                                                            }
                                                            dVar4 = StrToD("1.0e+ 1",0x18,0.0,
                                                                           &local_4,&local_5,0x20);
                                                            if (NAN(dVar4)) {
                                                              if (local_4 != 0) {
                                                                uVar2 = 0xe19;
                                                                goto LAB_0084dcf1;
                                                              }
                                                              dVar4 = StrToD("1.0e- 1",0x18,0.0,
                                                                             &local_4,&local_5,0x20)
                                                              ;
                                                              if (NAN(dVar4)) {
                                                                if (local_4 != 0) {
                                                                  uVar2 = 0xe1d;
                                                                  goto LAB_0084dcf1;
                                                                }
                                                                dVar4 = StrToD("1.0e +1",0x18,0.0,
                                                                               &local_4,&local_5,
                                                                               0x20);
                                                                if (NAN(dVar4)) {
                                                                  if (local_4 != 0) {
                                                                    uVar2 = 0xe21;
                                                                    goto LAB_0084dcf1;
                                                                  }
                                                                  dVar4 = StrToD("1.0e -1",0x18,0.0,
                                                                                 &local_4,&local_5,
                                                                                 0x20);
                                                                  if (NAN(dVar4)) {
                                                                    if (local_4 != 0) {
                                                                      uVar2 = 0xe25;
                                                                      goto LAB_0084dcf1;
                                                                    }
                                                                    dVar4 = StrToD("0x1 2",0x99,0.0,
                                                                                   &local_4,&local_5
                                                                                   ,0x20);
                                                                    if ((dVar4 != 18.0) ||
                                                                       (NAN(dVar4))) {
                                                                      pcVar1 = "18.0";
                                                                      pcVar3 = 
                                                  "StrToD(\"0x1 2\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x4032000000000000;
                                                  uVar2 = 0xe2d;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe2e;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x0 0",0x99,1.0,&local_4,
                                                                   &local_5,0x20);
                                                    uVar5 = 0;
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = 
                                                  "StrToD(\"0x0 0\", flags, 1.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar2 = 0xe30;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe31;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x1 2 3 4 5 6 7 8 9",0x99,NAN,
                                                                   &local_4,&local_5,0x20);
                                                    if ((dVar4 != 4886718345.0) || (NAN(dVar4))) {
                                                      pcVar1 = "static_cast<double>(0x123456789)";
                                                      pcVar3 = 
                                                  "StrToD(\"0x1 2 3 4 5 6 7 8 9\", flags, Double::NaN(), &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x41f2345678900000;
                                                  uVar2 = 0xe35;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe36;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD(" 0x1 2 ",0x99,0.0,&local_4,
                                                                   &local_5,0x20);
                                                    if ((dVar4 != 18.0) || (NAN(dVar4))) {
                                                      pcVar1 = "18.0";
                                                      pcVar3 = 
                                                  "StrToD(\" 0x1 2 \", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x4032000000000000;
                                                  uVar2 = 0xe39;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe3a;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD(" 0x0 ",0x99,1.0,&local_4,
                                                                   &local_5,0x20);
                                                    uVar5 = 0;
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = 
                                                  "StrToD(\" 0x0 \", flags, 1.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar2 = 0xe3d;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe3e;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD(" 0x1 2 3 4 5 6 7 8 9 ",0x99,NAN,
                                                                   &local_4,&local_5,0x20);
                                                    if ((dVar4 != 4886718345.0) || (NAN(dVar4))) {
                                                      pcVar1 = "static_cast<double>(0x123456789)";
                                                      pcVar3 = 
                                                  "StrToD(\" 0x1 2 3 4 5 6 7 8 9 \", flags, Double::NaN(), &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x41f2345678900000;
                                                  uVar2 = 0xe42;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe43;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0xa b c d e f",0x99,0.0,&local_4
                                                                   ,&local_5,0x20);
                                                    if ((dVar4 != 11259375.0) || (NAN(dVar4))) {
                                                      pcVar1 = "static_cast<double>(0xabcdef)";
                                                      pcVar3 = 
                                                  "StrToD(\"0xa b c d e f\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x416579bde0000000;
                                                  uVar2 = 0xe47;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe48;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x 1 2",0x99,0.0,&local_4,
                                                                   &local_5,0x20);
                                                    if (NAN(dVar4)) {
                                                      if (local_4 != 0) {
                                                        uVar2 = 0xe4c;
                                                        goto LAB_0084dcf1;
                                                      }
                                                      dVar4 = StrToD("0 x0",0x99,1.0,&local_4,
                                                                     &local_5,0x20);
                                                      if (NAN(dVar4)) {
                                                        if (local_4 != 0) {
                                                          uVar2 = 0xe50;
                                                          goto LAB_0084dcf1;
                                                        }
                                                        dVar4 = StrToD("0x1 2  3 4 5 6 7 8 9",0x99,
                                                                       NAN,&local_4,&local_5,0x20);
                                                        if (NAN(dVar4)) {
                                                          if (local_4 != 0) {
                                                            uVar2 = 0xe55;
                                                            goto LAB_0084dcf1;
                                                          }
                                                          dVar4 = StrToD(" 0 x1 2 ",0x99,0.0,
                                                                         &local_4,&local_5,0x20);
                                                          if (NAN(dVar4)) {
                                                            if (local_4 != 0) {
                                                              uVar2 = 0xe59;
                                                              goto LAB_0084dcf1;
                                                            }
                                                            dVar4 = StrToD("0x0 3p0",0x99,0.0,
                                                                           &local_4,&local_5,0x20);
                                                            if ((dVar4 != 3.0) || (NAN(dVar4))) {
                                                              pcVar1 = "3.0";
                                                              pcVar3 = 
                                                  "StrToD(\"0x0 3p0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x4008000000000000;
                                                  uVar2 = 0xe5c;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe5d;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x.0 0p0",0x99,0.0,&local_4,
                                                                   &local_5,0x20);
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = 
                                                  "StrToD(\"0x.0 0p0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0;
                                                  uVar2 = 0xe60;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe61;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x3.0 0p0",0x99,0.0,&local_4,
                                                                   &local_5,0x20);
                                                    if ((dVar4 != 3.0) || (NAN(dVar4))) {
                                                      pcVar1 = "3.0";
                                                      pcVar3 = 
                                                  "StrToD(\"0x3.0 0p0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x4008000000000000;
                                                  uVar2 = 0xe64;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe65;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x0 3.p0",0x99,0.0,&local_4,
                                                                   &local_5,0x20);
                                                    if ((dVar4 != 3.0) || (NAN(dVar4))) {
                                                      pcVar1 = "3.0";
                                                      pcVar3 = 
                                                  "StrToD(\"0x0 3.p0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x4008000000000000;
                                                  uVar2 = 0xe68;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe69;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD("0x 3p0",0x99,0.0,&local_4,
                                                                   &local_5,0);
                                                    if (NAN(dVar4)) {
                                                      if (local_4 != 0) {
                                                        uVar2 = 0xe6d;
                                                        goto LAB_0084dcf1;
                                                      }
                                                      dVar4 = StrToD("0x.0 p0",0x99,0.0,&local_4,
                                                                     &local_5,0);
                                                      if (NAN(dVar4)) {
                                                        if (local_4 != 0) {
                                                          uVar2 = 0xe71;
                                                          goto LAB_0084dcf1;
                                                        }
                                                        dVar4 = StrToD("0x3.0p0 0",0x99,0.0,&local_4
                                                                       ,&local_5,0);
                                                        if (NAN(dVar4)) {
                                                          if (local_4 != 0) {
                                                            uVar2 = 0xe75;
                                                            goto LAB_0084dcf1;
                                                          }
                                                          dVar4 = StrToD("0x0 3.p 0",0x99,0.0,
                                                                         &local_4,&local_5,0);
                                                          if (NAN(dVar4)) {
                                                            if (local_4 != 0) {
                                                              uVar2 = 0xe79;
                                                              goto LAB_0084dcf1;
                                                            }
                                                            dVar4 = StrToD("0x3p+ 0",0x99,0.0,
                                                                           &local_4,&local_5,0);
                                                            if (NAN(dVar4)) {
                                                              if (local_4 != 0) {
                                                                uVar2 = 0xe7d;
                                                                goto LAB_0084dcf1;
                                                              }
                                                              dVar4 = StrToD("0x.0p- 0",0x99,0.0,
                                                                             &local_4,&local_5,0);
                                                              if (NAN(dVar4)) {
                                                                if (local_4 != 0) {
                                                                  uVar2 = 0xe81;
                                                                  goto LAB_0084dcf1;
                                                                }
                                                                dVar4 = StrToD("0x3.0p +0",0x99,0.0,
                                                                               &local_4,&local_5,0);
                                                                if (NAN(dVar4)) {
                                                                  if (local_4 != 0) {
                                                                    uVar2 = 0xe85;
                                                                    goto LAB_0084dcf1;
                                                                  }
                                                                  processed_all = &local_5;
                                                                  char_separator = '\0';
                                                                  dVar4 = StrToD("0x0 3.p -0",0x99,
                                                                                 0.0,&local_4,
                                                                                 processed_all,0);
                                                                  if (NAN(dVar4)) {
                                                                    if (local_4 != 0) {
                                                                      uVar2 = 0xe89;
                                                                      goto LAB_0084dcf1;
                                                                    }
                                                                    dVar4 = StrToD16("0x1@2",(int)&
                                                  local_4,0.0,(int *)&local_5,processed_all,
                                                  char_separator,in_R9W);
                                                  if ((dVar4 != 18.0) || (NAN(dVar4))) {
                                                    pcVar1 = "18.0";
                                                    pcVar3 = 
                                                  "StrToD16(\"0x1@2\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x4032000000000000;
                                                  uVar2 = 0xe94;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe95;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD16("0x0@0",(int)&local_4,1.0,
                                                                     (int *)&local_5,processed_all,
                                                                     char_separator,in_R9W);
                                                    uVar5 = 0;
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = 
                                                  "StrToD16(\"0x0@0\", flags, 1.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar2 = 0xe98;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe99;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD16("0x1@2@3@4@5@6@7@8@9",
                                                                     (int)&local_4,NAN,
                                                                     (int *)&local_5,processed_all,
                                                                     char_separator,in_R9W);
                                                    if ((dVar4 != 4886718345.0) || (NAN(dVar4))) {
                                                      pcVar1 = "static_cast<double>(0x123456789)";
                                                      pcVar3 = 
                                                  "StrToD16(\"0x1@2@3@4@5@6@7@8@9\", flags, Double::NaN(), &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x41f2345678900000;
                                                  uVar2 = 0xe9d;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xe9e;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD16(" 0x1@2 ",(int)&local_4,0.0,
                                                                     (int *)&local_5,processed_all,
                                                                     char_separator,in_R9W);
                                                    if ((dVar4 != 18.0) || (NAN(dVar4))) {
                                                      pcVar1 = "18.0";
                                                      pcVar3 = 
                                                  "StrToD16(\" 0x1@2 \", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x4032000000000000;
                                                  uVar2 = 0xea1;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xea2;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD16("0xa@b@c@d@e@f",(int)&local_4,
                                                                     0.0,(int *)&local_5,
                                                                     processed_all,char_separator,
                                                                     in_R9W);
                                                    if ((dVar4 != 11259375.0) || (NAN(dVar4))) {
                                                      pcVar1 = "static_cast<double>(0xabcdef)";
                                                      pcVar3 = 
                                                  "StrToD16(\"0xa@b@c@d@e@f\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x416579bde0000000;
                                                  uVar2 = 0xea6;
                                                  }
                                                  else {
                                                    if (local_5 == false) {
                                                      uVar2 = 0xea7;
                                                      goto LAB_0084de3c;
                                                    }
                                                    dVar4 = StrToD16("0x@1@2",(int)&local_4,0.0,
                                                                     (int *)&local_5,processed_all,
                                                                     char_separator,in_R9W);
                                                    if (NAN(dVar4)) {
                                                      if (local_4 != 0) {
                                                        uVar2 = 0xeac;
                                                        goto LAB_0084dcf1;
                                                      }
                                                      dVar4 = StrToD16("0@x0",(int)&local_4,1.0,
                                                                       (int *)&local_5,processed_all
                                                                       ,char_separator,in_R9W);
                                                      if (NAN(dVar4)) {
                                                        if (local_4 != 0) {
                                                          uVar2 = 0xeb1;
                                                          goto LAB_0084dcf1;
                                                        }
                                                        dVar4 = StrToD16("0x1@2@@3@4@5@6@7@8@9",
                                                                         (int)&local_4,NAN,
                                                                         (int *)&local_5,
                                                                         processed_all,
                                                                         char_separator,in_R9W);
                                                        if (NAN(dVar4)) {
                                                          if (local_4 != 0) {
                                                            uVar2 = 0xeb6;
                                                            goto LAB_0084dcf1;
                                                          }
                                                          dVar4 = StrToD16("0x0@3p0",(int)&local_4,
                                                                           0.0,(int *)&local_5,
                                                                           processed_all,
                                                                           char_separator,in_R9W);
                                                          if ((dVar4 == 3.0) && (!NAN(dVar4))) {
                                                            if (local_5 == false) {
                                                              uVar2 = 0xebb;
                                                            }
                                                            else {
                                                              dVar4 = StrToD16("0x.0@0p0",
                                                                               (int)&local_4,0.0,
                                                                               (int *)&local_5,
                                                                               processed_all,
                                                                               char_separator,in_R9W
                                                                              );
                                                              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                                pcVar1 = "0.0";
                                                                pcVar3 = 
                                                  "StrToD16(\"0x.0@0p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0;
                                                  uVar2 = 0xebf;
                                                  goto LAB_0084de16;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xec0;
                                                  }
                                                  else {
                                                    dVar4 = StrToD16("0x3.0@0p0",(int)&local_4,0.0,
                                                                     (int *)&local_5,processed_all,
                                                                     char_separator,in_R9W);
                                                    if ((dVar4 != 3.0) || (NAN(dVar4))) {
                                                      pcVar1 = "3.0";
                                                      pcVar3 = 
                                                  "StrToD16(\"0x3.0@0p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x4008000000000000;
                                                  uVar2 = 0xec4;
                                                  goto LAB_0084de16;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xec5;
                                                  }
                                                  else {
                                                    dVar4 = StrToD16("0x0@3.p0",(int)&local_4,0.0,
                                                                     (int *)&local_5,processed_all,
                                                                     char_separator,in_R9W);
                                                    if ((dVar4 != 3.0) || (NAN(dVar4))) {
                                                      pcVar1 = "3.0";
                                                      pcVar3 = 
                                                  "StrToD16(\"0x0@3.p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x4008000000000000;
                                                  uVar2 = 0xec9;
                                                  goto LAB_0084de16;
                                                  }
                                                  if (local_5 != false) {
                                                    return;
                                                  }
                                                  uVar2 = 0xeca;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0084de3c;
                                                  }
                                                  pcVar1 = "3.0";
                                                  pcVar3 = 
                                                  "StrToD16(\"0x0@3p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x4008000000000000;
                                                  uVar2 = 0xeba;
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD16(\"0x1@2@@3@4@5@6@7@8@9\", flags, Double::NaN(), &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xeb5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD16(\"0@x0\", flags, 1.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xeb0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD16(\"0x@1@2\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xeab;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x0 3.p -0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe88;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x3.0p +0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe84;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x.0p- 0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe80;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x3p+ 0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe7c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x0 3.p 0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe78;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x3.0p0 0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe74;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x.0 p0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe70;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x 3p0\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe6c;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\" 0 x1 2 \", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe58;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x1 2  3 4 5 6 7 8 9\", flags, Double::NaN(), &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe54;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0 x0\", flags, 1.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe4f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0x 1 2\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe4b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e -1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe24;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e +1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe20;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e- 1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe1c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e+ 1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe18;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"- 1.0e1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe14;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"+ 1.0e1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe10;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0 e1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe0c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e 1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe08;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e1 0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xe00;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"0  1.0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdfc;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1. 0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdf8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1 .0\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdf4;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e -1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdd8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e +1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdd4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e- 1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdd0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e+ 1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdcc;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"- 1.0e1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdc8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"+ 1.0e1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdc4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0 e1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdc0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"1.0e 1\", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdbc;
                                                  }
                                                }
                                                else {
                                                  pcVar1 = "Double::NaN()";
                                                  pcVar3 = 
                                                  "StrToD(\"1.0e1 \", flags, 0.0, &processed, &all_used, separator)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xdb8;
                                                }
                                              }
                                              else {
                                                pcVar1 = "Double::NaN()";
                                                pcVar3 = 
                                                "StrToD(\"1.0e1 0\", flags, 0.0, &processed, &all_used, separator)"
                                                ;
                                                uVar5 = 0x7ff8000000000000;
                                                uVar2 = 0xdb4;
                                              }
                                            }
                                            else {
                                              pcVar1 = "Double::NaN()";
                                              pcVar3 = 
                                              "StrToD(\"0  1.0\", flags, 0.0, &processed, &all_used, separator)"
                                              ;
                                              uVar5 = 0x7ff8000000000000;
                                              uVar2 = 0xdb0;
                                            }
                                          }
                                          else {
                                            pcVar1 = "Double::NaN()";
                                            pcVar3 = 
                                            "StrToD(\"1. 0\", flags, 0.0, &processed, &all_used, separator)"
                                            ;
                                            uVar5 = 0x7ff8000000000000;
                                            uVar2 = 0xdac;
                                          }
                                        }
                                        else {
                                          pcVar1 = "Double::NaN()";
                                          pcVar3 = 
                                          "StrToD(\"1 .0\", flags, 0.0, &processed, &all_used, separator)"
                                          ;
                                          uVar5 = 0x7ff8000000000000;
                                          uVar2 = 0xda8;
                                        }
                                      }
                                      else {
                                        pcVar1 = "Double::NaN()";
                                        pcVar3 = 
                                        "StrToD(\" 1.0\", flags, 0.0, &processed, &all_used, separator)"
                                        ;
                                        uVar5 = 0x7ff8000000000000;
                                        uVar2 = 0xda4;
                                      }
                                    }
                                  }
                                }
                                else {
                                  pcVar1 = "Double::NaN()";
                                  pcVar3 = 
                                  "StrToD(\"1.0e\'-1\", flags, 0.0, &processed, &all_used, separator)"
                                  ;
                                  uVar5 = 0x7ff8000000000000;
                                  uVar2 = 0xd95;
                                }
                              }
                              else {
                                pcVar1 = "Double::NaN()";
                                pcVar3 = 
                                "StrToD(\"1.0e\'+1\", flags, 0.0, &processed, &all_used, separator)"
                                ;
                                uVar5 = 0x7ff8000000000000;
                                uVar2 = 0xd91;
                              }
                            }
                            else {
                              pcVar1 = "Double::NaN()";
                              pcVar3 = 
                              "StrToD(\"1.0e-\'1\", flags, 0.0, &processed, &all_used, separator)";
                              uVar5 = 0x7ff8000000000000;
                              uVar2 = 0xd8d;
                            }
                          }
                          else {
                            pcVar1 = "Double::NaN()";
                            pcVar3 = 
                            "StrToD(\"1.0e+\'1\", flags, 0.0, &processed, &all_used, separator)";
                            uVar5 = 0x7ff8000000000000;
                            uVar2 = 0xd89;
                          }
                        }
                        else {
                          pcVar1 = "Double::NaN()";
                          pcVar3 = 
                          "StrToD(\"-\'1.0e1\", flags, 0.0, &processed, &all_used, separator)";
                          uVar5 = 0x7ff8000000000000;
                          uVar2 = 0xd85;
                        }
                      }
                      else {
                        pcVar1 = "Double::NaN()";
                        pcVar3 = 
                        "StrToD(\"+\'1.0e1\", flags, 0.0, &processed, &all_used, separator)";
                        uVar5 = 0x7ff8000000000000;
                        uVar2 = 0xd81;
                      }
                    }
                    else {
                      pcVar1 = "Double::NaN()";
                      pcVar3 = "StrToD(\"1.0\'e1\", flags, 0.0, &processed, &all_used, separator)";
                      uVar5 = 0x7ff8000000000000;
                      uVar2 = 0xd7d;
                    }
                  }
                  else {
                    pcVar1 = "Double::NaN()";
                    pcVar3 = "StrToD(\"1.0e\'1\", flags, 0.0, &processed, &all_used, separator)";
                    uVar5 = 0x7ff8000000000000;
                    uVar2 = 0xd79;
                  }
                }
                else {
                  pcVar1 = "Double::NaN()";
                  pcVar3 = "StrToD(\"1.0e1\'\", flags, 0.0, &processed, &all_used, separator)";
                  uVar5 = 0x7ff8000000000000;
                  uVar2 = 0xd75;
                }
              }
              else {
                pcVar1 = "Double::NaN()";
                pcVar3 = "StrToD(\"1.0e1\'0\", flags, 0.0, &processed, &all_used, separator)";
                uVar5 = 0x7ff8000000000000;
                uVar2 = 0xd71;
              }
            }
            else {
              pcVar1 = "Double::NaN()";
              pcVar3 = "StrToD(\"0\'\'1.0\", flags, 0.0, &processed, &all_used, separator)";
              uVar5 = 0x7ff8000000000000;
              uVar2 = 0xd6d;
            }
          }
          else {
            pcVar1 = "Double::NaN()";
            pcVar3 = "StrToD(\"1.\'0\", flags, 0.0, &processed, &all_used, separator)";
            uVar5 = 0x7ff8000000000000;
            uVar2 = 0xd69;
          }
        }
        else {
          pcVar1 = "Double::NaN()";
          pcVar3 = "StrToD(\"1\'.0\", flags, 0.0, &processed, &all_used, separator)";
          uVar5 = 0x7ff8000000000000;
          uVar2 = 0xd65;
        }
      }
      else {
        pcVar1 = "Double::NaN()";
        pcVar3 = "StrToD(\"\'1.0\", flags, 0.0, &processed, &all_used, separator)";
        uVar5 = 0x7ff8000000000000;
        uVar2 = 0xd61;
      }
    }
  }
LAB_0084de16:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar5,dVar4,
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar2,pcVar1,pcVar3);
  abort();
}

Assistant:

TEST(StringToDoubleSeparator) {
  int flags;
  int processed;
  bool all_used;
  uc16 separator;

  separator = '\'';
  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(1.0, StrToD("000'001.0'0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0'0'0'0'0'1.0'0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("'1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1'.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.'0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0''1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1'0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1'", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0'e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+'1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("-'1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e-'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'+1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'-1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(1.0, StrToD("000 001.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0 0 0 0 0 1.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1 .0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1. 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0  1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 ", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0 e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+ 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("- 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+ 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e- 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e +1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e -1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(1.0, StrToD("000 001.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0 0 0 0 0 1.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  000 001.0 0   ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("   0 0 0 0 0 1.0 0   ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" 1.0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("1 .0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1. 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0  1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("1.0e1 ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("1.0e 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0 e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+ 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("- 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+ 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e- 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e +1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e -1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_HEX_FLOATS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(18.0, StrToD("0x1 2", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("0x0 0", flags, 1.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD("0x1 2 3 4 5 6 7 8 9", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(18.0, StrToD(" 0x1 2 ", flags, 0.0,
                        &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 0x0 ", flags, 1.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD(" 0x1 2 3 4 5 6 7 8 9 ", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0xabcdef),
           StrToD("0xa b c d e f", flags, 0.0,
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("0x 1 2", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0 x0", flags, 1.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x1 2  3 4 5 6 7 8 9", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 0 x1 2 ", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(3.0,
           StrToD("0x0 3p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0,
           StrToD("0x.0 0p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD("0x3.0 0p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD("0x0 3.p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("0x 3p0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x.0 p0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3.0p0 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x0 3.p 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3p+ 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x.0p- 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3.0p +0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x0 3.p -0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  separator = 0x202F;
  char char_separator = '@';
  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_HEX_FLOATS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(18.0,
           StrToD16("0x1@2", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD16("0x0@0", flags, 1.0, &processed, &all_used,
                         char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD16("0x1@2@3@4@5@6@7@8@9", flags, Double::NaN(),
                    &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(18.0, StrToD16(" 0x1@2 ", flags, 0.0,
                          &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0xabcdef),
           StrToD16("0xa@b@c@d@e@f", flags, 0.0,
                    &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD16("0x@1@2", flags, 0.0,
                    &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD16("0@x0", flags, 1.0,
                    &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD16("0x1@2@@3@4@5@6@7@8@9", flags, Double::NaN(),
                  &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(3.0,
           StrToD16("0x0@3p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(0.0,
           StrToD16("0x.0@0p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD16("0x3.0@0p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD16("0x0@3.p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);
}